

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

void __thiscall
Kvm::addEnvProc(Kvm *this,Value *env,char *schemeName,_func_Value_ptr_Kvm_ptr_Value_ptr *proc)

{
  _func_Value_ptr_Kvm_ptr_Value_ptr *__s;
  allocator<char> local_79;
  string local_78;
  undefined1 local_48 [8];
  GcGuard guard;
  Value *result2;
  Value *result1;
  _func_Value_ptr_Kvm_ptr_Value_ptr *proc_local;
  char *schemeName_local;
  Value *env_local;
  Kvm *this_local;
  
  result2 = (Value *)0x0;
  guard.times_ = 0;
  result1 = (Value *)proc;
  proc_local = (_func_Value_ptr_Kvm_ptr_Value_ptr *)schemeName;
  schemeName_local = (char *)env;
  env_local = (Value *)this;
  GcGuard::GcGuard((GcGuard *)local_48,&this->gc_);
  GcGuard::pushLocalStackRoot((GcGuard *)local_48,&result2);
  GcGuard::pushLocalStackRoot((GcGuard *)local_48,(Value **)&guard.times_);
  guard.times_ = (long)makeProc(this,(_func_Value_ptr_Kvm_ptr_Value_ptr *)result1);
  __s = proc_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,(char *)__s,&local_79);
  result2 = makeSymbol(this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  defineVariable(this,result2,(Value *)guard.times_,(Value *)schemeName_local);
  GcGuard::~GcGuard((GcGuard *)local_48);
  return;
}

Assistant:

void Kvm::addEnvProc(Value *env, const char *schemeName, const Value * (*proc)(Kvm *vm, const Value *))
{
    const Value *result1 = nullptr;
    const Value *result2 = nullptr;
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result1);
    guard.pushLocalStackRoot(&result2);
    result2 = makeProc(proc);
    result1 = makeSymbol(schemeName);
    defineVariable(result1, result2, env);
}